

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_ExtensionDeclarationEnforcement_Test::TestBody
          (CommandLineInterfaceTest_ExtensionDeclarationEnforcement_Test *this)

{
  string_view name;
  string_view expected_substring;
  string_view expected_substring_00;
  string_view expected_substring_01;
  string_view contents;
  string local_38;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str =
       "\n    syntax = \"proto2\";\n    package foo;\n    message Foo {\n      extensions 4000 to max [\n        declaration = {\n          number: 5000,\n          full_name: \".foo.o\"\n          type: \"int32\"\n        },\n        declaration = {\n          number: 9000,\n          full_name: \".baz.z\"\n          type: \".foo.Bar\"\n      }];\n    }\n\n    extend Foo {\n      optional int32 o = 5000;\n      repeated int32 i = 9000;\n    }"
  ;
  contents._M_len = 0x199;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir foo.proto","");
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  expected_substring._M_str =
       "extension field 9000 is expected to be type \".foo.Bar\", not \"int32\"";
  expected_substring._M_len = 0x43;
  CommandLineInterfaceTester::ExpectErrorSubstring
            ((CommandLineInterfaceTester *)this,expected_substring);
  expected_substring_00._M_str =
       "extension field 9000 is expected to have field name \".baz.z\", not \".foo.i\"";
  expected_substring_00._M_len = 0x4a;
  CommandLineInterfaceTester::ExpectErrorSubstring
            ((CommandLineInterfaceTester *)this,expected_substring_00);
  expected_substring_01._M_str = "extension field 9000 is expected to be optional";
  expected_substring_01._M_len = 0x2f;
  CommandLineInterfaceTester::ExpectErrorSubstring
            ((CommandLineInterfaceTester *)this,expected_substring_01);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, ExtensionDeclarationEnforcement) {
  CreateTempFile("foo.proto", R"schema(
    syntax = "proto2";
    package foo;
    message Foo {
      extensions 4000 to max [
        declaration = {
          number: 5000,
          full_name: ".foo.o"
          type: "int32"
        },
        declaration = {
          number: 9000,
          full_name: ".baz.z"
          type: ".foo.Bar"
      }];
    }

    extend Foo {
      optional int32 o = 5000;
      repeated int32 i = 9000;
    })schema");

  Run("protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir foo.proto");
  ExpectErrorSubstring(
      "extension field 9000 is expected to be type \".foo.Bar\", not "
      "\"int32\"");
  ExpectErrorSubstring(
      "extension field 9000 is expected to have field name \".baz.z\", not "
      "\".foo.i\"");
  ExpectErrorSubstring("extension field 9000 is expected to be optional");
}